

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

iterator * __thiscall
google::
dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>::SetKey,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>
::insert_at<int_const&>
          (iterator *__return_storage_ptr__,
          dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>::SetKey,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>
          *this,size_type pos,int *args)

{
  int *piVar1;
  dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>::SetKey,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>
  dVar2;
  long lVar3;
  bool bVar4;
  length_error *this_00;
  const_iterator delpos;
  
  if ((char)((char)this[0x35] - (char)this[0x34]) != -1) {
    bVar4 = dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\xff'>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\xff'>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\xff'>_>
            ::test_deleted((dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>
                            *)this,pos);
    if (bVar4) {
      delpos.pos = (pointer)(*(long *)(this + 0x48) + (ulong)pos * 4);
      delpos.end = (pointer)(*(long *)(this + 0x48) + (ulong)(byte)this[0x36] * 4);
      delpos.ht = (dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>
                   *)this;
      dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\xff'>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\xff'>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\xff'>_>
      ::test_deleted((dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>
                      *)this,&delpos);
      this[0x34] = (dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>::SetKey,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>
                    )((char)this[0x34] + -1);
    }
    else {
      this[0x35] = (dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>::SetKey,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>
                    )((char)this[0x35] + '\x01');
    }
    lVar3 = *(long *)(this + 0x48);
    piVar1 = (int *)(lVar3 + (ulong)pos * 4);
    *piVar1 = *args;
    dVar2 = this[0x36];
    __return_storage_ptr__->ht =
         (dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>
          *)this;
    __return_storage_ptr__->pos = piVar1;
    __return_storage_ptr__->end = (pointer)(lVar3 + (ulong)(byte)dVar2 * 4);
    return __return_storage_ptr__;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this_00,"insert overflow");
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

size_type size() const { return num_elements - num_deleted; }